

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void Help(void)

{
  fprintf(_stderr,
          "-i [value] maximum intensity bin index\n-n no intensity uncertainty\n-b [file name] output bin file name (default: footprint.bin)\n-x [file name] output idx file name (default: footprint.idx)\n-z zip footprint data\n-u index file should include uncompressed data size\n-N no validation checks\n-h help\n-v version\n"
         );
  return;
}

Assistant:

void Help() {

  fprintf(stderr, "-i [value] maximum intensity bin index\n"
		  "-n no intensity uncertainty\n"
		  "-b [file name] output bin file name (default: footprint.bin)\n"
		  "-x [file name] output idx file name (default: footprint.idx)\n"
		  "-z zip footprint data\n"
		  "-u index file should include uncompressed data size\n"
		  "-N no validation checks\n"
		  "-h help\n"
		  "-v version\n");

}